

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowCustomAggregatorState::~WindowCustomAggregatorState(WindowCustomAggregatorState *this)

{
  AggregateInputData aggr_input_data;
  
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowCustomAggregatorState_02796ab8;
  if ((this->aggr).function.destructor != (aggregate_destructor_t)0x0) {
    aggr_input_data.bind_data.ptr = AggregateObject::GetFunctionData(&this->aggr);
    aggr_input_data.allocator =
         &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
    aggr_input_data.combine_type = PRESERVE_INPUT;
    (*(this->aggr).function.destructor)(&this->statef,&aggr_input_data,1);
  }
  ::std::_Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::~_Vector_base
            ((_Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)
             &this->frames);
  Vector::~Vector(&this->statef);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->state);
  AggregateObject::~AggregateObject(&this->aggr);
  WindowAggregatorLocalState::~WindowAggregatorLocalState(&this->super_WindowAggregatorLocalState);
  return;
}

Assistant:

WindowCustomAggregatorState::~WindowCustomAggregatorState() {
	if (aggr.function.destructor) {
		AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
		aggr.function.destructor(statef, aggr_input_data, 1);
	}
}